

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O0

WORD32 ihevcd_set_display_frame(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  long lVar1;
  WORD32 WVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  void *pv_mem_ctxt;
  WORD32 size;
  WORD32 num_samples;
  UWORD8 *pu1_chroma_buf;
  WORD32 buf_ret;
  UWORD8 *pu1_buf;
  pic_buf_t *ps_pic_buf;
  UWORD32 num_bufs;
  codec_t *ps_codec;
  WORD32 i;
  ivd_set_display_frame_op_t *ps_dec_disp_op;
  ivd_set_display_frame_ip_t *ps_dec_disp_ip;
  WORD32 ret;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar3;
  uint uVar4;
  long local_70;
  long local_60;
  undefined8 *local_58;
  int local_3c;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  *(undefined4 *)(lVar1 + 0x34) = 0;
  if (*(int *)(lVar1 + 0x38) != 0) {
    uVar3 = *(uint *)(in_RSI + 8);
    local_70 = 0;
    if (0x3f < uVar3) {
      uVar3 = 0x40;
    }
    *(uint *)(lVar1 + 0x34) = uVar3;
    local_58 = *(undefined8 **)(lVar1 + 0x140);
    uVar4 = uVar3;
    if (*(int *)(lVar1 + 0x3c) == 1) {
      local_70 = (**(code **)(lVar1 + 0x3f48))
                           (*(undefined8 *)(lVar1 + 0x3f58),0x80,
                            *(int *)(in_RSI + 0x21c) * 2 * uVar3);
      if (local_70 == 0) {
        return 1;
      }
      *(long *)(lVar1 + 0x158) = local_70;
    }
    for (local_3c = 0; local_3c < (int)uVar3; local_3c = local_3c + 1) {
      *local_58 = *(undefined8 *)(in_RSI + (long)local_3c * 0x308 + 0x18);
      if (*(int *)(lVar1 + 0x3c) == 1) {
        local_60 = local_70;
        local_70 = local_70 + (ulong)(uint)(*(int *)(in_RSI + 0x21c) << 1);
      }
      else {
        local_60 = *(long *)(in_RSI + (long)local_3c * 0x308 + 0x20);
      }
      local_58[1] = local_60;
      WVar2 = ihevc_buf_mgr_add(*(buf_mgr_t **)(lVar1 + 0x138),local_58,local_3c);
      if (WVar2 != 0) {
        *(undefined4 *)(lVar1 + 0x90) = 0x3d7;
        return 0x3d7;
      }
      ihevc_buf_mgr_set_status((buf_mgr_t *)CONCAT44(uVar4,in_stack_ffffffffffffff78),0,0x1105fb);
      local_58 = local_58 + 0x3e0;
      memcpy((void *)(lVar1 + 0x44b0 + (long)*(int *)(lVar1 + 0x106b0) * 0x308),
             (void *)(in_RSI + 0x10 + (long)local_3c * 0x308),0x308);
      *(int *)(lVar1 + 0x106b0) = *(int *)(lVar1 + 0x106b0) + 1;
    }
  }
  *(undefined4 *)(in_RDX + 4) = 0;
  return 0;
}

Assistant:

WORD32 ihevcd_set_display_frame(iv_obj_t *ps_codec_obj,
                                void *pv_api_ip,
                                void *pv_api_op)
{
    WORD32 ret = IV_SUCCESS;

    ivd_set_display_frame_ip_t *ps_dec_disp_ip;
    ivd_set_display_frame_op_t *ps_dec_disp_op;

    WORD32 i;

    codec_t *ps_codec = (codec_t *)(ps_codec_obj->pv_codec_handle);

    ps_dec_disp_ip = (ivd_set_display_frame_ip_t *)pv_api_ip;
    ps_dec_disp_op = (ivd_set_display_frame_op_t *)pv_api_op;

    ps_codec->i4_num_disp_bufs = 0;
    if(ps_codec->i4_share_disp_buf)
    {
        UWORD32 num_bufs = ps_dec_disp_ip->num_disp_bufs;
        pic_buf_t *ps_pic_buf;
        UWORD8 *pu1_buf;
        WORD32 buf_ret;

        UWORD8 *pu1_chroma_buf = NULL;
        num_bufs = MIN(num_bufs, BUF_MGR_MAX_CNT);
        ps_codec->i4_num_disp_bufs = num_bufs;

        ps_pic_buf = (pic_buf_t *)ps_codec->ps_pic_buf;

        /* If color format is 420P, then allocate chroma buffers to hold semiplanar
         * chroma data */
        if(ps_codec->e_chroma_fmt == IV_YUV_420P)
        {
            WORD32 num_samples = ps_dec_disp_ip->s_disp_buffer[0].u4_min_out_buf_size[1] << 1;
            WORD32 size = num_samples * num_bufs;
            void *pv_mem_ctxt = ps_codec->pv_mem_ctxt;

            pu1_chroma_buf = ps_codec->pf_aligned_alloc(pv_mem_ctxt, 128, size);
            RETURN_IF((NULL == pu1_chroma_buf), IV_FAIL);

            ps_codec->pu1_cur_chroma_ref_buf = pu1_chroma_buf;
        }
        for(i = 0; i < (WORD32)num_bufs; i++)
        {
            /* Stride is not available in some cases here.
               So store base pointers to buffer manager now,
               and update these pointers once header is decoded */
            pu1_buf =  ps_dec_disp_ip->s_disp_buffer[i].pu1_bufs[0];
            ps_pic_buf->pu1_luma = pu1_buf;

            if(ps_codec->e_chroma_fmt == IV_YUV_420P)
            {
                pu1_buf = pu1_chroma_buf;
                pu1_chroma_buf += ps_dec_disp_ip->s_disp_buffer[0].u4_min_out_buf_size[1] << 1;
            }
            else
            {
                /* For YUV 420SP case use display buffer itself as chroma ref buffer */
                pu1_buf =  ps_dec_disp_ip->s_disp_buffer[i].pu1_bufs[1];
            }

            ps_pic_buf->pu1_chroma = pu1_buf;

            buf_ret = ihevc_buf_mgr_add((buf_mgr_t *)ps_codec->pv_pic_buf_mgr, ps_pic_buf, i);

            if(0 != buf_ret)
            {
                ps_codec->i4_error_code = IHEVCD_BUF_MGR_ERROR;
                return IHEVCD_BUF_MGR_ERROR;
            }

            /* Mark pic buf as needed for display */
            /* This ensures that till the buffer is explicitly passed to the codec,
             * application owns the buffer. Decoder is allowed to use a buffer only
             * when application sends it through fill this buffer call in OMX
             */
            ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_pic_buf_mgr, i, BUF_MGR_DISP);

            ps_pic_buf++;

            /* Store display buffers in codec context. Needed for 420p output */
            memcpy(&ps_codec->s_disp_buffer[ps_codec->i4_share_disp_buf_cnt],
                   &ps_dec_disp_ip->s_disp_buffer[i],
                   sizeof(ps_dec_disp_ip->s_disp_buffer[i]));

            ps_codec->i4_share_disp_buf_cnt++;

        }
    }

    ps_dec_disp_op->u4_error_code = 0;
    return ret;

}